

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O2

vector<float,_pstd::pmr::polymorphic_allocator<float>_> * __thiscall
pbrt::NanoVDBMediumProvider::GetMaxDensityGrid
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *__return_storage_ptr__,
          NanoVDBMediumProvider *this,Allocator alloc,Point3i *res)

{
  size_t sVar1;
  memory_resource local_70;
  float local_64;
  function<void_(long)> local_60;
  anon_class_24_3_a25db8d5 local_40;
  
  sVar1 = 0x40000;
  (res->super_Tuple3<pbrt::Point3,_int>).x = 0x40;
  (res->super_Tuple3<pbrt::Point3,_int>).y = 0x40;
  (res->super_Tuple3<pbrt::Point3,_int>).z = 0x40;
  local_70._vptr_memory_resource = (_func_int **)res;
  if (LOGGING_LogLevel < 1) {
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/media.h"
        ,0x291,"Starting nanovdb grid GetMaxDensityGrid()");
    sVar1 = (long)(res->super_Tuple3<pbrt::Point3,_int>).z *
            (long)(res->super_Tuple3<pbrt::Point3,_int>).y *
            (long)(res->super_Tuple3<pbrt::Point3,_int>).x;
  }
  local_64 = 0.0;
  local_40.res = (Point3i **)alloc.memoryResource;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (__return_storage_ptr__,sVar1,&local_64,(polymorphic_allocator<float> *)&local_40);
  sVar1 = __return_storage_ptr__->nStored;
  local_40.res = (Point3i **)&local_70;
  local_40.this = this;
  local_40.maxGrid = __return_storage_ptr__;
  std::function<void(long)>::
  function<pbrt::NanoVDBMediumProvider::GetMaxDensityGrid(pstd::pmr::polymorphic_allocator<std::byte>,pbrt::Point3<int>*)const::_lambda(unsigned_long)_1_,void>
            ((function<void(long)> *)&local_60,&local_40);
  ParallelFor(0,sVar1,&local_60);
  std::_Function_base::~_Function_base(&local_60.super__Function_base);
  if (LOGGING_LogLevel < 1) {
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/media.h"
        ,0x2c1,"Finished nanovdb grid GetMaxDensityGrid()");
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::vector<Float> GetMaxDensityGrid(Allocator alloc, Point3i *res) const {
#if 0
    // For debugging: single, medium-wide majorant...
    *res = Point3i(1, 1, 1);
    Float minDensity, maxDensity;
    densityFloatGrid->tree().extrema(minDensity, maxDensity);
    return pstd::vector<Float>(1, maxDensity, alloc);
#else
        *res = Point3i(64, 64, 64);

        LOG_VERBOSE("Starting nanovdb grid GetMaxDensityGrid()");

        pstd::vector<Float> maxGrid(res->x * res->y * res->z, 0.f, alloc);

        ParallelFor(0, maxGrid.size(), [&](size_t index) {
            // Indices into maxGrid
            int x = index % res->x;
            int y = (index / res->x) % res->y;
            int z = index / (res->x * res->y);
            CHECK_EQ(index, x + res->x * (y + res->y * z));

            // World (aka medium) space bounds of this max grid cell
            Bounds3f wb(bounds.Lerp(Point3f(Float(x) / res->x, Float(y) / res->y,
                                            Float(z) / res->z)),
                        bounds.Lerp(Point3f(Float(x + 1) / res->x, Float(y + 1) / res->y,
                                            Float(z + 1) / res->z)));

            // Compute corresponding NanoVDB index-space bounds in floating-point.
            nanovdb::Vec3R i0 = densityFloatGrid->worldToIndexF(
                nanovdb::Vec3R(wb.pMin.x, wb.pMin.y, wb.pMin.z));
            nanovdb::Vec3R i1 = densityFloatGrid->worldToIndexF(
                nanovdb::Vec3R(wb.pMax.x, wb.pMax.y, wb.pMax.z));

            // Now find integer index-space bounds, accounting for both
            // filtering and the overall index bounding box.
            auto bbox = densityFloatGrid->indexBBox();
            Float delta = 1.f;  // Filter slop
            int nx0 = std::max(int(i0[0] - delta), bbox.min()[0]);
            int nx1 = std::min(int(i1[0] + delta), bbox.max()[0]);
            int ny0 = std::max(int(i0[1] - delta), bbox.min()[1]);
            int ny1 = std::min(int(i1[1] + delta), bbox.max()[1]);
            int nz0 = std::max(int(i0[2] - delta), bbox.min()[2]);
            int nz1 = std::min(int(i1[2] + delta), bbox.max()[2]);

            Float maxValue = 0;
            auto accessor = densityFloatGrid->getAccessor();
            // Apparently nanovdb integer bounding boxes are inclusive on
            // the upper end...
            for (int nz = nz0; nz <= nz1; ++nz)
                for (int ny = ny0; ny <= ny1; ++ny)
                    for (int nx = nx0; nx <= nx1; ++nx)
                        maxValue = std::max(maxValue, accessor.getValue({nx, ny, nz}));

            // Only write into maxGrid once when we're done to minimize
            // cache thrashing..
            maxGrid[index] = maxValue;
        });

        LOG_VERBOSE("Finished nanovdb grid GetMaxDensityGrid()");
        return maxGrid;
#endif
    }